

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_secp256k1.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::Secp256k1::MulTweakPrivkeySecp256k1Ec
          (ByteData *__return_storage_ptr__,Secp256k1 *this,ByteData *privkey,ByteData *tweak)

{
  pointer ctx;
  CfdError error_code;
  undefined8 uVar1;
  size_t sVar2;
  CfdException *this_00;
  string *message;
  uchar *tweak32;
  string *in_stack_fffffffffffffe20;
  CfdError in_stack_fffffffffffffe2c;
  CfdException *in_stack_fffffffffffffe30;
  allocator local_179;
  string local_178 [32];
  CfdSourceLocation local_158;
  CfdError local_13c;
  undefined1 local_138 [4];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *tweak_byte;
  vector<unsigned_char,_std::allocator<unsigned_char>_> privkey_work;
  secp256k1_context *context;
  string local_f0 [32];
  CfdSourceLocation local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  undefined1 local_75;
  allocator local_61;
  string local_60 [32];
  CfdSourceLocation local_40;
  ByteData *local_28;
  ByteData *tweak_local;
  ByteData *privkey_local;
  Secp256k1 *this_local;
  
  local_28 = tweak;
  tweak_local = privkey;
  privkey_local = (ByteData *)this;
  this_local = (Secp256k1 *)__return_storage_ptr__;
  if (this->secp256k1_context_ == (void *)0x0) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0xc2;
    local_40.funcname = "MulTweakPrivkeySecp256k1Ec";
    logger::warn<>(&local_40,"Secp256k1 context is NULL.");
    local_75 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_60,"Secp256k1 context is NULL.",&local_61);
    CfdException::CfdException
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20);
    local_75 = 0;
    __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar2 = ByteData::GetDataSize(privkey);
  if (sVar2 != 0x20) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 199;
    local_90.funcname = "MulTweakPrivkeySecp256k1Ec";
    logger::warn<>(&local_90,"Invalid Argument privkey size.");
    local_b2 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_b0,"Invalid privkey size.",&local_b1);
    CfdException::CfdException
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20);
    local_b2 = 0;
    __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar2 = ByteData::GetDataSize(local_28);
  if (sVar2 != 0x20) {
    local_d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_d0.filename = local_d0.filename + 1;
    local_d0.line = 0xcc;
    local_d0.funcname = "MulTweakPrivkeySecp256k1Ec";
    logger::warn<>(&local_d0,"Invalid Argument tweak size.");
    context._6_1_ = 1;
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_f0,"Invalid tweak size.",(allocator *)((long)&context + 7))
    ;
    CfdException::CfdException(this_00,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20);
    context._6_1_ = 0;
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  privkey_work.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this->secp256k1_context_;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_byte,
                     tweak_local);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138,local_28);
  ctx = privkey_work.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  local_120 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138;
  message = (string *)
            ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4afd30);
  tweak32 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_120);
  error_code = secp256k1_ec_privkey_tweak_mul((secp256k1_context *)ctx,(uchar *)message,tweak32);
  local_13c = error_code;
  if (error_code != kCfdIllegalArgumentError) {
    local_158.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_158.filename = local_158.filename + 1;
    local_158.line = 0xd9;
    local_158.funcname = "MulTweakPrivkeySecp256k1Ec";
    logger::warn<int&>(&local_158,"secp256k1_ec_privkey_tweak_mul Error.({})",&local_13c);
    uVar1 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_178,"Secp256k1 privkey tweak mul Error.",&local_179);
    CfdException::CfdException(in_stack_fffffffffffffe30,error_code,message);
    __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_byte);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  return __return_storage_ptr__;
}

Assistant:

ByteData Secp256k1::MulTweakPrivkeySecp256k1Ec(
    const ByteData& privkey, const ByteData& tweak) {
  if (secp256k1_context_ == NULL) {
    warn(CFD_LOG_SOURCE, "Secp256k1 context is NULL.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 context is NULL.");
  }
  if (privkey.GetDataSize() != kPrivkeyByteSize) {
    warn(CFD_LOG_SOURCE, "Invalid Argument privkey size.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid privkey size.");
  }
  if (tweak.GetDataSize() != kTweakByteSize) {
    warn(CFD_LOG_SOURCE, "Invalid Argument tweak size.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid tweak size.");
  }

  secp256k1_context* context =
      static_cast<secp256k1_context*>(secp256k1_context_);

  std::vector<uint8_t> privkey_work = privkey.GetBytes();
  const std::vector<uint8_t>& tweak_byte = tweak.GetBytes();
  int ret = secp256k1_ec_privkey_tweak_mul(
      context, privkey_work.data(), tweak_byte.data());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_ec_privkey_tweak_mul Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 privkey tweak mul Error.");
  }

  return ByteData(privkey_work);
}